

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QCborContainerPrivate * assignContainer(QCborContainerPrivate **d,QCborContainerPrivate *x)

{
  QCborContainerPrivate *this;
  
  this = *d;
  if (this != x) {
    if (this != (QCborContainerPrivate *)0x0) {
      QCborContainerPrivate::deref(this);
    }
    if (x != (QCborContainerPrivate *)0x0) {
      LOCK();
      (x->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (x->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *d = x;
    this = x;
  }
  return this;
}

Assistant:

static QCborContainerPrivate *assignContainer(QCborContainerPrivate *&d, QCborContainerPrivate *x)
{
    if (d == x)
        return d;
    if (d)
        d->deref();
    if (x)
        x->ref.ref();
    return d = x;
}